

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O0

void adios2::helper::ThrowNested<std::runtime_error>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  string m;
  int in_stack_0000024c;
  string *in_stack_00000250;
  string *in_stack_00000258;
  string *in_stack_00000260;
  string *in_stack_00000268;
  LogMode in_stack_00000280;
  string *__t;
  runtime_error local_58 [16];
  string local_48 [72];
  
  __t = local_48;
  MakeMessage(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
              in_stack_0000024c,in_stack_00000280);
  std::runtime_error::runtime_error(local_58,__t);
  std::throw_with_nested<std::runtime_error>((runtime_error *)__t);
}

Assistant:

void ThrowNested(const std::string &component, const std::string &source,
                 const std::string &activity, const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw_with_nested(T(m));
}